

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_program.c
# Opt level: O0

int archive_write_add_filter_program(archive *_a,char *cmd)

{
  long *plVar1;
  int iVar2;
  archive_write_filter *f_00;
  void *pvVar3;
  char *pcVar4;
  archive_write_program_data *paVar5;
  size_t sVar6;
  archive_string *paVar7;
  int magic_test;
  private_data_conflict7 *data;
  archive_write_filter *f;
  char *cmd_local;
  archive *_a_local;
  
  f_00 = __archive_write_allocate_filter(_a);
  iVar2 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_add_filter_program");
  if (iVar2 != -0x1e) {
    pvVar3 = calloc(1,0x28);
    f_00->data = pvVar3;
    if (f_00->data != (void *)0x0) {
      plVar1 = (long *)f_00->data;
      pcVar4 = strdup(cmd);
      plVar1[4] = (long)pcVar4;
      if (plVar1[4] != 0) {
        paVar5 = __archive_write_program_allocate(cmd);
        *plVar1 = (long)paVar5;
        if (*plVar1 != 0) {
          sVar6 = strlen(cmd);
          paVar7 = archive_string_ensure((archive_string *)(plVar1 + 1),sVar6 + 10);
          if (paVar7 != (archive_string *)0x0) {
            plVar1[2] = 0;
            archive_strncat((archive_string *)(plVar1 + 1),"Program: ",9);
            archive_strcat((archive_string *)(plVar1 + 1),cmd);
            f_00->name = (char *)plVar1[1];
            f_00->code = 4;
            f_00->open = archive_compressor_program_open;
            f_00->write = archive_compressor_program_write;
            f_00->close = archive_compressor_program_close;
            f_00->free = archive_compressor_program_free;
            return 0;
          }
        }
      }
    }
    archive_compressor_program_free(f_00);
    archive_set_error(_a,0xc,"Can\'t allocate memory for filter program");
  }
  return -0x1e;
}

Assistant:

int
archive_write_add_filter_program(struct archive *_a, const char *cmd)
{
	struct archive_write_filter *f = __archive_write_allocate_filter(_a);
	struct private_data *data;
	static const char prefix[] = "Program: ";

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_add_filter_program");

	f->data = calloc(1, sizeof(*data));
	if (f->data == NULL)
		goto memerr;
	data = (struct private_data *)f->data;

	data->cmd = strdup(cmd);
	if (data->cmd == NULL)
		goto memerr;

	data->pdata = __archive_write_program_allocate(cmd);
	if (data->pdata == NULL)
		goto memerr;

	/* Make up a description string. */
	if (archive_string_ensure(&data->description,
	    strlen(prefix) + strlen(cmd) + 1) == NULL)
		goto memerr;
	archive_strcpy(&data->description, prefix);
	archive_strcat(&data->description, cmd);

	f->name = data->description.s;
	f->code = ARCHIVE_FILTER_PROGRAM;
	f->open = archive_compressor_program_open;
	f->write = archive_compressor_program_write;
	f->close = archive_compressor_program_close;
	f->free = archive_compressor_program_free;
	return (ARCHIVE_OK);
memerr:
	archive_compressor_program_free(f);
	archive_set_error(_a, ENOMEM,
	    "Can't allocate memory for filter program");
	return (ARCHIVE_FATAL);
}